

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QRectF *sr)

{
  bool bVar1;
  bool bVar2;
  ClassId CVar3;
  int iVar4;
  TransformationType TVar5;
  QPlatformPixmap *pQVar6;
  QRasterPaintEnginePrivate *pQVar7;
  QRasterPaintEngineState *pQVar8;
  QRasterBuffer *color;
  undefined8 in_RCX;
  QRasterBuffer *in_RSI;
  QSpanData *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  qreal qVar10;
  QColor QVar11;
  QRasterPaintEngineState *s_1;
  QRasterPaintEnginePrivate *d_1;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QImage *image;
  QPlatformPixmap *pd;
  QRectF translatedSource;
  QImage image_1;
  QRect clippedSource;
  QRect *in_stack_fffffffffffffd48;
  ImageConversionFlag IVar12;
  QRasterBuffer *in_stack_fffffffffffffd50;
  QRectF *in_stack_fffffffffffffd58;
  QPixmap *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  QPointF *in_stack_fffffffffffffd78;
  QRectF *in_stack_fffffffffffffd80;
  QColor *in_stack_fffffffffffffd90;
  QImage *in_stack_fffffffffffffd98;
  QRasterBuffer *in_stack_fffffffffffffda0;
  bool local_241;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  QPointF *in_stack_fffffffffffffdd0;
  QRasterPaintEngine *in_stack_fffffffffffffdd8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 uStack_1cc;
  undefined1 local_1c8 [24];
  QPointF local_1b0;
  QPointF local_1a0;
  QPointF local_190;
  QSize local_180;
  QSizeF local_178;
  QSizeF local_168;
  QSizeF local_158;
  QPoint local_148;
  QPoint local_140;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 local_108 [16];
  QImageData *local_f8;
  QRect local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined4 local_c0;
  undefined4 local_bc;
  QColor local_b8;
  undefined1 local_a8 [24];
  QPointF local_90;
  QPointF local_80;
  QPointF local_70;
  QSize local_60;
  QSizeF local_58;
  QSizeF local_48;
  QSizeF local_38;
  undefined8 local_28;
  undefined4 local_20;
  undefined2 local_1c;
  undefined8 local_18;
  undefined4 local_10;
  undefined2 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QPixmap::handle((QPixmap *)0x56b926);
  CVar3 = QPlatformPixmap::classId(pQVar6);
  if (CVar3 == RasterClass) {
    pQVar6 = pQVar6 + 1;
    iVar4 = QImage::depth((QImage *)pQVar6);
    if (iVar4 == 1) {
      pQVar7 = d_func((QRasterPaintEngine *)0x56b98a);
      pQVar8 = state((QRasterPaintEngine *)0x56b99c);
      TVar5 = QTransform::type((QTransform *)in_stack_fffffffffffffd58);
      local_241 = false;
      if ((int)TVar5 < 2) {
        local_38 = QRectF::size(in_stack_fffffffffffffd58);
        local_48 = QRectF::size(in_stack_fffffffffffffd58);
        bVar1 = ::operator==((QSizeF *)in_stack_fffffffffffffd50,(QSizeF *)in_stack_fffffffffffffd48
                            );
        local_241 = false;
        if (bVar1) {
          local_58 = QRectF::size(in_stack_fffffffffffffd58);
          local_60 = QPixmap::size(in_stack_fffffffffffffd60);
          local_241 = ::operator==((QSizeF *)in_stack_fffffffffffffd50,
                                   (QSize *)in_stack_fffffffffffffd48);
        }
      }
      IVar12 = (ImageConversionFlag)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      if (local_241 == false) {
        color = QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                          (&pQVar7->rasterBuffer);
        local_b8 = QPen::color((QPen *)in_stack_fffffffffffffd58);
        local_18 = local_b8._0_8_;
        local_10 = local_b8.ct._4_4_;
        local_c = local_b8.ct._8_2_;
        QRasterBuffer::colorizeBitmap(in_RSI,(QImage *)pQVar6,(QColor *)color);
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffd50,IVar12);
        (*(code *)in_RDI->rasterBuffer[2].colorSpace.d_ptr.d.ptr)
                  (in_RDI,in_RSI,local_a8,in_RCX,local_bc);
        QImage::~QImage((QImage *)in_stack_fffffffffffffd50);
      }
      else {
        ensurePen((QRasterPaintEngine *)in_stack_fffffffffffffd50);
        local_80 = QRectF::topLeft(in_stack_fffffffffffffd58);
        qVar9 = QTransform::dx(&(pQVar8->super_QPainterState).matrix);
        qVar10 = QTransform::dy(&(pQVar8->super_QPainterState).matrix);
        QPointF::QPointF(&local_90,qVar9,qVar10);
        local_70 = ::operator+((QPointF *)in_stack_fffffffffffffd58,
                               (QPointF *)in_stack_fffffffffffffd50);
        drawBitmap(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                   (QImage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),in_RDI);
      }
    }
    else {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffd50,
                 (ImageConversionFlag)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (*(code *)in_RDI->rasterBuffer[2].colorSpace.d_ptr.d.ptr)
                (in_RDI,in_RSI,pQVar6,in_RCX,local_c0);
    }
  }
  else {
    local_d0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_d0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_e0 = QRectF::toAlignedRect();
    local_f0 = QPixmap::rect((QPixmap *)
                             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    local_d0 = (undefined1  [16])
               QRect::intersected((QRect *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    (*pQVar6->_vptr_QPlatformPixmap[0x12])(local_108,pQVar6,local_d0);
    local_128 = 0xffffffffffffffff;
    local_120 = 0xffffffffffffffff;
    local_118 = 0xffffffffffffffff;
    local_110 = 0xffffffffffffffff;
    local_148 = QRect::topLeft(in_stack_fffffffffffffd48);
    local_140 = ::operator-((QPoint *)in_stack_fffffffffffffd50);
    QPointF::QPointF((QPointF *)in_stack_fffffffffffffd50,(QPoint *)in_stack_fffffffffffffd48);
    QRectF::translated(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    iVar4 = QImage::depth((QImage *)local_108);
    if (iVar4 == 1) {
      pQVar7 = d_func((QRasterPaintEngine *)0x56be2b);
      pQVar8 = state((QRasterPaintEngine *)0x56be3d);
      TVar5 = QTransform::type((QTransform *)in_stack_fffffffffffffd58);
      bVar1 = false;
      if ((int)TVar5 < 2) {
        local_158 = QRectF::size(in_stack_fffffffffffffd58);
        local_168 = QRectF::size(in_stack_fffffffffffffd58);
        bVar2 = ::operator==((QSizeF *)in_stack_fffffffffffffd50,(QSizeF *)in_stack_fffffffffffffd48
                            );
        bVar1 = false;
        if (bVar2) {
          local_178 = QRectF::size(in_stack_fffffffffffffd58);
          local_180 = QPixmap::size(in_stack_fffffffffffffd60);
          bVar1 = ::operator==((QSizeF *)in_stack_fffffffffffffd50,
                               (QSize *)in_stack_fffffffffffffd48);
        }
      }
      IVar12 = (ImageConversionFlag)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      if (bVar1 == false) {
        in_stack_fffffffffffffd50 =
             QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                       (&pQVar7->rasterBuffer);
        QVar11 = QPen::color((QPen *)in_RSI);
        local_1d8 = QVar11._0_8_;
        local_28 = local_1d8;
        local_1d0 = QVar11.ct._4_4_;
        local_20 = local_1d0;
        uStack_1cc = QVar11.ct._8_2_;
        local_1c = uStack_1cc;
        QRasterBuffer::colorizeBitmap
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
        QFlags<Qt::ImageConversionFlag>::QFlags
                  ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffd50,IVar12);
        (*(code *)in_RDI->rasterBuffer[2].colorSpace.d_ptr.d.ptr)
                  (in_RDI,in_RSI,local_1c8,&local_128,local_1dc);
        QImage::~QImage((QImage *)in_stack_fffffffffffffd50);
      }
      else {
        ensurePen((QRasterPaintEngine *)in_stack_fffffffffffffd50);
        local_1a0 = QRectF::topLeft(in_stack_fffffffffffffd58);
        qVar9 = QTransform::dx(&(pQVar8->super_QPainterState).matrix);
        qVar10 = QTransform::dy(&(pQVar8->super_QPainterState).matrix);
        QPointF::QPointF(&local_1b0,qVar9,qVar10);
        local_190 = ::operator+((QPointF *)in_stack_fffffffffffffd58,
                                (QPointF *)in_stack_fffffffffffffd50);
        drawBitmap((QRasterPaintEngine *)pQVar7,(QPointF *)pQVar8,
                   (QImage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),in_RDI);
      }
    }
    else {
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)in_stack_fffffffffffffd50,
                 (ImageConversionFlag)((ulong)in_RSI >> 0x20));
      (*(code *)in_RDI->rasterBuffer[2].colorSpace.d_ptr.d.ptr)
                (in_RDI,in_RSI,local_108,&local_128,local_1e0);
    }
    QImage::~QImage((QImage *)in_stack_fffffffffffffd50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pixmap, const QRectF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), r=" << r << " sr=" << sr << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap* pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), sr);
            }
        } else {
            drawImage(r, image, sr);
        }
    } else {
        QRect clippedSource = sr.toAlignedRect().intersected(pixmap.rect());
        const QImage image = pd->toImage(clippedSource);
        QRectF translatedSource = sr.translated(-clippedSource.topLeft());
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate
                && r.size() == sr.size()
                && r.size() == pixmap.size()) {
                ensurePen();
                drawBitmap(r.topLeft() + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
                return;
            } else {
                drawImage(r, d->rasterBuffer->colorizeBitmap(image, s->pen.color()), translatedSource);
            }
        } else {
            drawImage(r, image, translatedSource);
        }
    }
}